

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O3

void __thiscall btMatrixX<float>::setZero(btMatrixX<float> *this)

{
  long lVar1;
  
  CProfileManager::Start_Profile("storage=0");
  lVar1 = (long)(this->m_storage).m_size;
  if (lVar1 != 0) {
    memset((this->m_storage).m_data,0,lVar1 << 2);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void setZero()
	{
		{
			BT_PROFILE("storage=0");
			btSetZero(&m_storage[0],m_storage.size());
			//memset(&m_storage[0],0,sizeof(T)*m_storage.size());
			//for (int i=0;i<m_storage.size();i++)
	//			m_storage[i]=0;
		}
	}